

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::SerializeWithCachedSizes
          (CategoricalMapping *this,CodedOutputStream *output)

{
  uint32 uVar1;
  ValueOnUnknownUnion value;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->MappingType_).stringtoint64map_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&((this->MappingType_).stringtoint64map_)->super_MessageLite,output);
  }
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x65) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (*(char **)(this->ValueOnUnknown_).int64value_,
               *(int *)((undefined8 *)(this->ValueOnUnknown_).int64value_ + 1),SERIALIZE,
               "CoreML.Specification.CategoricalMapping.strValue");
    if (this->_oneof_case_[1] == 0x65) {
      value = this->ValueOnUnknown_;
    }
    else {
      value.int64value_ = (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x65,(string *)value,output)
    ;
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0x66) {
    google::protobuf::internal::WireFormatLite::WriteInt64
              (0x66,(this->ValueOnUnknown_).int64value_,output);
    return;
  }
  return;
}

Assistant:

void CategoricalMapping::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CategoricalMapping)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
  if (has_stringtoint64map()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *MappingType_.stringtoint64map_, output);
  }

  // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
  if (has_int64tostringmap()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *MappingType_.int64tostringmap_, output);
  }

  // string strValue = 101;
  if (has_strvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->strvalue().data(), this->strvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalMapping.strValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      101, this->strvalue(), output);
  }

  // int64 int64Value = 102;
  if (has_int64value()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(102, this->int64value(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CategoricalMapping)
}